

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-socket.c
# Opt level: O3

CURLcode cf_socket_open(Curl_cfilter *cf,Curl_easy *data)

{
  Curl_sockaddr_ex *addr;
  uint *sockfd;
  undefined1 *puVar1;
  uchar uVar2;
  void *pvVar3;
  void *pvVar4;
  connectdata *pcVar5;
  bool bVar6;
  _Bool _Var7;
  uchar uVar8;
  CURLcode CVar9;
  uint uVar10;
  int iVar11;
  uint remote_scope;
  int iVar12;
  if2ip_result_t iVar13;
  int *piVar14;
  size_t sVar15;
  uint *puVar16;
  ulong uVar17;
  int iVar18;
  ushort uVar19;
  socklen_t __len;
  ulong uVar20;
  byte *__s;
  char *__nptr;
  char *pcVar21;
  ushort uVar22;
  uint uVar23;
  curltime cVar24;
  Curl_dns_entry *h;
  int on;
  curl_socklen_t size;
  curl_socklen_t onoff;
  char buffer [256];
  Curl_sockaddr_storage add;
  Curl_dns_entry *local_248;
  undefined4 local_240;
  socklen_t local_23c;
  sockaddr local_238;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  char local_1b8 [256];
  sockaddr local_b8;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  pvVar3 = cf->ctx;
  cVar24 = Curl_now();
  *(time_t *)((long)pvVar3 + 0x148) = cVar24.tv_sec;
  *(int *)((long)pvVar3 + 0x150) = cVar24.tv_usec;
  addr = (Curl_sockaddr_ex *)((long)pvVar3 + 8);
  sockfd = (uint *)((long)pvVar3 + 0x98);
  CVar9 = socket_open(data,addr,(curl_socket_t *)sockfd);
  uVar20 = (ulong)CVar9;
  if (CVar9 == CURLE_OK) {
    pvVar4 = cf->ctx;
    _Var7 = Curl_addr2string((sockaddr *)((long)pvVar4 + 0x18),
                             *(curl_socklen_t *)((long)pvVar4 + 0x14),(char *)((long)pvVar4 + 0xe0),
                             (int *)((long)pvVar4 + 0x110));
    if (_Var7) {
      uVar10 = addr->family;
      if (uVar10 == 10) {
        if (data != (Curl_easy *)0x0) {
          if (((data->set).field_0x8bd & 0x10) != 0) {
            pcVar21 = "  Trying [%s]:%d...";
LAB_006b4bcd:
            Curl_infof(data,pcVar21,(long)pvVar3 + 0xe0,(ulong)*(uint *)((long)pvVar3 + 0x110));
          }
LAB_006b4be5:
          uVar10 = addr->family;
          goto LAB_006b4be9;
        }
LAB_006b4bf5:
        if (*(int *)((long)pvVar3 + 0xc) == 1) {
          uVar20 = *(ulong *)&(data->set).field_0x8ba;
          if ((uVar20 >> 0x21 & 1) != 0) {
            local_238._0_4_ = 1;
            iVar11 = setsockopt(*sockfd,6,1,&local_238,4);
            uVar20 = *(ulong *)&(data->set).field_0x8ba;
            if (((uint)uVar20 >> 0x1c & 1) != 0 && iVar11 < 0) {
              piVar14 = __errno_location();
              pcVar21 = Curl_strerror(*piVar14,local_1b8,0x100);
              Curl_infof(data,"Could not set TCP_NODELAY: %s",pcVar21);
              uVar20 = *(ulong *)&(data->set).field_0x8ba;
            }
          }
          if ((uVar20 >> 0x27 & 1) != 0) {
            tcpkeepalive(data,*sockfd);
          }
        }
      }
      else {
        if (data != (Curl_easy *)0x0) {
          if (((data->set).field_0x8bd & 0x10) != 0) {
            pcVar21 = "  Trying %s:%d...";
            goto LAB_006b4bcd;
          }
          goto LAB_006b4be5;
        }
LAB_006b4be9:
        if ((uVar10 | 8) == 10) goto LAB_006b4bf5;
      }
      if ((data->set).fsockopt == (curl_sockopt_callback)0x0) {
LAB_006b4ce1:
        bVar6 = false;
      }
      else {
        Curl_set_in_callback(data,true);
        iVar11 = (*(data->set).fsockopt)((data->set).sockopt_client,*sockfd,CURLSOCKTYPE_IPCXN);
        Curl_set_in_callback(data,false);
        if (iVar11 != 2) {
          uVar20 = 0x2a;
          if (iVar11 != 0) goto LAB_006b4b41;
          goto LAB_006b4ce1;
        }
        bVar6 = true;
      }
      uVar10 = addr->family;
      if ((uVar10 | 8) == 10) {
        pcVar5 = cf->conn;
        iVar11 = *(int *)((long)pvVar3 + 0x98);
        remote_scope = Curl_ipv6_scope((sockaddr *)((long)pvVar3 + 0x18));
        local_248 = (Curl_dns_entry *)0x0;
        uVar22 = (data->set).localport;
        uVar23 = (uint)(data->set).localportrange;
        __s = (byte *)(data->set).str[8];
        local_240 = 1;
        if (uVar22 != 0 || __s != (byte *)0x0) {
          local_1c8 = 0;
          uStack_1c0 = 0;
          local_1d8 = 0;
          uStack_1d0 = 0;
          local_1e8 = 0;
          uStack_1e0 = 0;
          local_1f8 = 0;
          uStack_1f0 = 0;
          local_208 = 0;
          uStack_200 = 0;
          local_218 = 0;
          uStack_210 = 0;
          local_228 = 0;
          uStack_220 = 0;
          local_238.sa_family = 0;
          local_238.sa_data[0] = '\0';
          local_238.sa_data[1] = '\0';
          local_238.sa_data[2] = '\0';
          local_238.sa_data[3] = '\0';
          local_238.sa_data[4] = '\0';
          local_238.sa_data[5] = '\0';
          local_238.sa_data[6] = '\0';
          local_238.sa_data[7] = '\0';
          local_238.sa_data[8] = '\0';
          local_238.sa_data[9] = '\0';
          local_238.sa_data[10] = '\0';
          local_238.sa_data[0xb] = '\0';
          local_238.sa_data[0xc] = '\0';
          local_238.sa_data[0xd] = '\0';
          if ((__s == (byte *)0x0) || (sVar15 = strlen((char *)__s), 0xfe < sVar15)) {
            if (uVar10 == 2) {
LAB_006b50b3:
              local_238.sa_data._0_2_ = uVar22 << 8 | uVar22 >> 8;
              local_238.sa_family = 2;
              __len = 0x10;
            }
            else {
              __len = 0;
              if (uVar10 == 10) {
                local_238.sa_data._0_2_ = uVar22 << 8 | uVar22 >> 8;
                local_238.sa_family = 10;
                goto LAB_006b4e1e;
              }
            }
LAB_006b50cb:
            setsockopt(iVar11,0,0x18,&local_240,4);
            iVar18 = bind(iVar11,&local_238,__len);
            uVar19 = uVar22;
            while (iVar18 < 0) {
              uVar19 = uVar19 + 1;
              if (((int)uVar23 < 2) || (uVar19 == 0)) {
                puVar16 = (uint *)__errno_location();
                uVar10 = *puVar16;
                (data->state).os_errno = uVar10;
                pcVar21 = Curl_strerror(uVar10,local_1b8,0x100);
                Curl_failf(data,"bind failed with errno %d: %s",(ulong)uVar10,pcVar21);
                uVar20 = 0x2d;
                goto LAB_006b4b41;
              }
              if (((data->set).field_0x8bd & 0x10) != 0) {
                Curl_infof(data,"Bind to local port %d failed, trying next",(ulong)(uVar19 - 1));
              }
              local_238.sa_data._0_2_ = uVar19 * 0x100 | uVar19 >> 8;
              iVar18 = bind(iVar11,&local_238,__len);
              uVar22 = uVar22 + 1;
              uVar23 = uVar23 - 1;
            }
            local_23c = 0x80;
            local_b8.sa_family = 0;
            local_b8.sa_data[0] = '\0';
            local_b8.sa_data[1] = '\0';
            local_b8.sa_data[2] = '\0';
            local_b8.sa_data[3] = '\0';
            local_b8.sa_data[4] = '\0';
            local_b8.sa_data[5] = '\0';
            local_b8.sa_data[6] = '\0';
            local_b8.sa_data[7] = '\0';
            local_b8.sa_data[8] = '\0';
            local_b8.sa_data[9] = '\0';
            local_b8.sa_data[10] = '\0';
            local_b8.sa_data[0xb] = '\0';
            local_b8.sa_data[0xc] = '\0';
            local_b8.sa_data[0xd] = '\0';
            local_a8 = 0;
            uStack_a0 = 0;
            local_98 = 0;
            uStack_90 = 0;
            local_88 = 0;
            uStack_80 = 0;
            local_78 = 0;
            uStack_70 = 0;
            local_68 = 0;
            uStack_60 = 0;
            local_58 = 0;
            uStack_50 = 0;
            local_48 = 0;
            uStack_40 = 0;
            iVar11 = getsockname(iVar11,&local_b8,&local_23c);
            if (iVar11 < 0) {
              puVar16 = (uint *)__errno_location();
              uVar10 = *puVar16;
              (data->state).os_errno = uVar10;
              pcVar21 = Curl_strerror(uVar10,local_1b8,0x100);
              Curl_failf(data,"getsockname() failed with errno %d: %s",(ulong)uVar10,pcVar21);
              goto LAB_006b521c;
            }
            if (((data->set).field_0x8bd & 0x10) != 0) {
              Curl_infof(data,"Local port: %hu",(ulong)uVar22);
            }
            puVar1 = &(pcVar5->bits).field_0x2;
            *puVar1 = *puVar1 | 0x40;
            uVar20 = 0;
          }
          else {
            memset(local_1b8,0,0x100);
            iVar18 = *__s - 0x69;
            if ((iVar18 == 0) && (iVar18 = __s[1] - 0x66, iVar18 == 0)) {
              iVar18 = 0x21 - (uint)__s[2];
            }
            else {
              iVar18 = -iVar18;
            }
            if (iVar18 != 0) {
              iVar12 = strncmp("host!",(char *)__s,5);
              if (iVar12 != 0) goto LAB_006b4e5e;
              __s = __s + 5;
              goto LAB_006b4f67;
            }
            __s = __s + 3;
LAB_006b4e5e:
            sVar15 = strlen((char *)__s);
            iVar12 = setsockopt(iVar11,1,0x19,__s,(int)sVar15 + 1);
            if (iVar12 == 0) {
              uVar20 = 0;
              if (((data->set).field_0x8bd & 0x10) != 0) {
                uVar20 = 0;
                Curl_infof(data,"socket successfully bound to interface \'%s\'",__s);
              }
              goto LAB_006b5226;
            }
            iVar13 = Curl_if2ip(uVar10,remote_scope,pcVar5->scope_id,(char *)__s,local_1b8,0x100);
            if (iVar13 == IF2IP_FOUND) {
              if (((data->set).field_0x8bd & 0x10) != 0) {
                Curl_infof(data,"Local Interface %s is ip %s using address family %i",__s,local_1b8,
                           (ulong)uVar10);
              }
LAB_006b5040:
              __len = 0;
              if (uVar10 == 2) {
                iVar18 = inet_pton(2,local_1b8,local_238.sa_data + 2);
                if (0 < iVar18) goto LAB_006b50b3;
              }
              else if (uVar10 == 10) {
                pcVar21 = strchr(local_1b8,0x25);
                if (pcVar21 == (char *)0x0) {
                  __nptr = (char *)0x0;
                }
                else {
                  __nptr = pcVar21 + 1;
                  *pcVar21 = '\0';
                }
                iVar18 = inet_pton(10,local_1b8,local_238.sa_data + 6);
                if (0 < iVar18) {
                  local_238.sa_data._0_2_ = uVar22 << 8 | uVar22 >> 8;
                  local_238.sa_family = 10;
                  if (__nptr != (char *)0x0) {
                    uVar17 = strtoul(__nptr,(char **)0x0,10);
                    uVar20 = 1;
                    if (uVar17 >> 0x20 != 0) goto LAB_006b5226;
                    uStack_220 = CONCAT44(uStack_220._4_4_,(int)uVar17);
                  }
                }
LAB_006b4e1e:
                __len = 0x1c;
              }
              goto LAB_006b50cb;
            }
            uVar20 = (ulong)iVar13;
            if (iVar13 == IF2IP_AF_NOT_SUPPORTED) goto LAB_006b5226;
            if (iVar13 == IF2IP_NOT_FOUND) {
              if (iVar18 != 0) {
LAB_006b4f67:
                uVar2 = pcVar5->ip_version;
                if (uVar10 == 2) {
                  uVar8 = '\x01';
LAB_006b4f86:
                  pcVar5->ip_version = uVar8;
                }
                else if (uVar10 == 10) {
                  uVar8 = '\x02';
                  goto LAB_006b4f86;
                }
                Curl_resolv(data,(char *)__s,0x50,false,&local_248);
                pcVar5->ip_version = uVar2;
                if (local_248 != (Curl_dns_entry *)0x0) {
                  Curl_printable_address(local_248->addr,local_1b8,0x100);
                  if (((data->set).field_0x8bd & 0x10) != 0) {
                    Curl_infof(data,"Name \'%s\' family %i resolved to \'%s\' family %i",__s,
                               (ulong)uVar10,local_1b8,(ulong)(uint)local_248->addr->ai_family);
                  }
                  Curl_resolv_unlock(data,local_248);
                  uVar20 = 1;
                  if (local_248->addr->ai_family != uVar10) goto LAB_006b5226;
                  goto LAB_006b5040;
                }
                goto LAB_006b507a;
              }
              pcVar21 = "Couldn\'t bind to interface \'%s\'";
            }
            else {
              if (iVar18 != 0) goto LAB_006b4f67;
LAB_006b507a:
              puVar1 = &(data->state).field_0x74c;
              *puVar1 = *puVar1 & 0xf7;
              pcVar21 = "Couldn\'t bind to \'%s\'";
            }
            Curl_failf(data,pcVar21,__s);
LAB_006b521c:
            uVar20 = 0x2d;
          }
LAB_006b5226:
          if ((int)uVar20 != 0) {
            if ((int)uVar20 == 1) {
              uVar20 = 7;
            }
            goto LAB_006b4b41;
          }
        }
      }
      curlx_nonblock(*(curl_socket_t *)((long)pvVar3 + 0x98),1);
      *(byte *)((long)pvVar3 + 0x17c) =
           *(byte *)((long)pvVar3 + 0x17c) & 0xfb | (*(int *)((long)pvVar3 + 0xc) != 2) << 2;
      uVar20 = 0;
      if (bVar6) {
        set_local_ip((Curl_cfilter *)cf->ctx,data);
        cVar24 = Curl_now();
        *(time_t *)((long)pvVar3 + 0x158) = cVar24.tv_sec;
        *(int *)((long)pvVar3 + 0x160) = cVar24.tv_usec;
        cf->field_0x24 = cf->field_0x24 | 1;
      }
      goto LAB_006b4b68;
    }
    puVar16 = (uint *)__errno_location();
    uVar10 = *puVar16;
    *(uint *)((long)pvVar4 + 0x178) = uVar10;
    pcVar21 = Curl_strerror(uVar10,local_1b8,0x100);
    Curl_failf(data,"sa_addr inet_ntop() failed with errno %d: %s",(ulong)uVar10,pcVar21);
    uVar20 = 2;
  }
LAB_006b4b41:
  if (*sockfd != 0xffffffff) {
    socket_close(data,cf->conn,1,*sockfd);
    *sockfd = 0xffffffff;
  }
  if (data == (Curl_easy *)0x0) {
    return (CURLcode)uVar20;
  }
LAB_006b4b68:
  if (((cf != (Curl_cfilter *)0x0) && ((*(ulong *)&(data->set).field_0x8ba & 0x10000000) != 0)) &&
     (0 < cf->cft->log_level)) {
    Curl_trc_cf_infof(data,cf,"cf_socket_open() -> %d, fd=%d",uVar20,(ulong)*sockfd);
  }
  return (CURLcode)uVar20;
}

Assistant:

static CURLcode cf_socket_open(struct Curl_cfilter *cf,
                              struct Curl_easy *data)
{
  struct cf_socket_ctx *ctx = cf->ctx;
  int error = 0;
  bool isconnected = FALSE;
  CURLcode result = CURLE_COULDNT_CONNECT;
  bool is_tcp;

  (void)data;
  DEBUGASSERT(ctx->sock == CURL_SOCKET_BAD);
  ctx->started_at = Curl_now();
  result = socket_open(data, &ctx->addr, &ctx->sock);
  if(result)
    goto out;

  result = set_remote_ip(cf, data);
  if(result)
    goto out;

#ifdef ENABLE_IPV6
  if(ctx->addr.family == AF_INET6) {
    set_ipv6_v6only(ctx->sock, 0);
    infof(data, "  Trying [%s]:%d...", ctx->r_ip, ctx->r_port);
  }
  else
#endif
    infof(data, "  Trying %s:%d...", ctx->r_ip, ctx->r_port);

#ifdef ENABLE_IPV6
  is_tcp = (ctx->addr.family == AF_INET
            || ctx->addr.family == AF_INET6) &&
           ctx->addr.socktype == SOCK_STREAM;
#else
  is_tcp = (ctx->addr.family == AF_INET) &&
           ctx->addr.socktype == SOCK_STREAM;
#endif
  if(is_tcp && data->set.tcp_nodelay)
    tcpnodelay(data, ctx->sock);

  nosigpipe(data, ctx->sock);

  Curl_sndbufset(ctx->sock);

  if(is_tcp && data->set.tcp_keepalive)
    tcpkeepalive(data, ctx->sock);

  if(data->set.fsockopt) {
    /* activate callback for setting socket options */
    Curl_set_in_callback(data, true);
    error = data->set.fsockopt(data->set.sockopt_client,
                               ctx->sock,
                               CURLSOCKTYPE_IPCXN);
    Curl_set_in_callback(data, false);

    if(error == CURL_SOCKOPT_ALREADY_CONNECTED)
      isconnected = TRUE;
    else if(error) {
      result = CURLE_ABORTED_BY_CALLBACK;
      goto out;
    }
  }

#ifndef CURL_DISABLE_BINDLOCAL
  /* possibly bind the local end to an IP, interface or port */
  if(ctx->addr.family == AF_INET
#ifdef ENABLE_IPV6
     || ctx->addr.family == AF_INET6
#endif
    ) {
    result = bindlocal(data, cf->conn, ctx->sock, ctx->addr.family,
                       Curl_ipv6_scope(&ctx->addr.sa_addr));
    if(result) {
      if(result == CURLE_UNSUPPORTED_PROTOCOL) {
        /* The address family is not supported on this interface.
           We can continue trying addresses */
        result = CURLE_COULDNT_CONNECT;
      }
      goto out;
    }
  }
#endif

  /* set socket non-blocking */
  (void)curlx_nonblock(ctx->sock, TRUE);
  ctx->sock_connected = (ctx->addr.socktype != SOCK_DGRAM);
out:
  if(result) {
    if(ctx->sock != CURL_SOCKET_BAD) {
      socket_close(data, cf->conn, TRUE, ctx->sock);
      ctx->sock = CURL_SOCKET_BAD;
    }
  }
  else if(isconnected) {
    set_local_ip(cf, data);
    ctx->connected_at = Curl_now();
    cf->connected = TRUE;
  }
  CURL_TRC_CF(data, cf, "cf_socket_open() -> %d, fd=%" CURL_FORMAT_SOCKET_T,
              result, ctx->sock);
  return result;
}